

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O3

void __thiscall
btMultiBodyDynamicsWorld::serialize(btMultiBodyDynamicsWorld *this,btSerializer *serializer)

{
  (**(code **)(*(long *)serializer + 0x40))(serializer);
  btDiscreteDynamicsWorld::serializeDynamicsWorldInfo
            (&this->super_btDiscreteDynamicsWorld,serializer);
  (*(this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
    _vptr_btCollisionWorld[0x2e])(this,serializer);
  btDiscreteDynamicsWorld::serializeRigidBodies(&this->super_btDiscreteDynamicsWorld,serializer);
  btCollisionWorld::serializeCollisionObjects((btCollisionWorld *)this,serializer);
  (**(code **)(*(long *)serializer + 0x48))(serializer);
  return;
}

Assistant:

void	btMultiBodyDynamicsWorld::serialize(btSerializer* serializer)
{

	serializer->startSerialization();

	serializeDynamicsWorldInfo( serializer);

	serializeMultiBodies(serializer);

	serializeRigidBodies(serializer);

	serializeCollisionObjects(serializer);

	serializer->finishSerialization();
}